

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

void free_trophy(TROPHY_DATA *trophy)

{
  void *in_RDI;
  CLogger *unaff_retaddr;
  string_view in_stack_00000008;
  char *in_stack_ffffffffffffffe8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffff0;
  
  if (in_RDI == (void *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    CLogger::Warn<>(unaff_retaddr,in_stack_00000008);
  }
  else if (*(long *)((long)in_RDI + 8) == 0) {
    if (in_RDI != (void *)0x0) {
      operator_delete(in_RDI,0x10);
    }
  }
  else {
    free_trophy((TROPHY_DATA *)in_stack_fffffffffffffff0);
    if (in_RDI != (void *)0x0) {
      operator_delete(in_RDI,0x10);
    }
  }
  return;
}

Assistant:

void free_trophy(TROPHY_DATA *trophy)
{
	if (!trophy)
	{
		RS.Logger.Warn("ERROR: Null trophy freed!");
		return;
	}

	if (trophy->next == nullptr)
	{
		delete trophy;
	}
	else
	{
		free_trophy(trophy->next);
		delete trophy;
	}
}